

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O2

bool __thiscall
Gudhi::persistence_matrix::
Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_false>_>_>
::is_non_zero(Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_false,_false>_>_>
              *this,ID_index rowIndex)

{
  node_ptr plVar1;
  Column_support *pCVar2;
  
  pCVar2 = &this->column_;
  plVar1 = (node_ptr)pCVar2;
  do {
    plVar1 = (((type *)&plVar1->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if (plVar1 == (node_ptr)pCVar2) break;
  } while (*(ID_index *)&plVar1[1].next_ != rowIndex);
  return plVar1 != (node_ptr)pCVar2;
}

Assistant:

inline bool Intrusive_list_column<Master_matrix>::is_non_zero(ID_index rowIndex) const
{
  // could be changed to dichotomic search as column is ordered by row index,
  // but I am not sure if it is really worth it as there is no random access
  // and the columns should not be that long anyway.
  for (const Entry& entry : column_)
    if (entry.get_row_index() == rowIndex) return true;

  return false;
}